

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveCreate(Parser *parser,int flags)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  pointer *__ptr;
  undefined4 in_register_00000034;
  CDirectiveFile *local_78;
  int64_t memoryAddress;
  vector<Expression,_std::allocator<Expression>_> list;
  StringLiteral inputName;
  path local_30;
  
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = Parser::parseExpressionList((Parser *)CONCAT44(in_register_00000034,flags),&list,2,2);
  if (!bVar1) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_0016bafe;
  }
  inputName._value._M_dataplus._M_p = (pointer)&inputName._value.field_2;
  inputName._value._M_string_length = 0;
  inputName._value.field_2._M_local_buf[0] = '\0';
  bVar1 = Expression::evaluateString
                    (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&inputName,false);
  if (bVar1) {
    bVar1 = Expression::evaluateInteger<long>
                      (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                       super__Vector_impl_data._M_finish + -1,&memoryAddress);
    if (!bVar1) goto LAB_0016baf0;
    std::make_unique<CDirectiveFile>();
    ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
              (&local_30,(filesystem *)&inputName,source);
    CDirectiveFile::initCreate(local_78,&local_30,memoryAddress);
    ghc::filesystem::path::~path(&local_30);
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
  }
  else {
LAB_0016baf0:
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::__cxx11::string::~string((string *)&inputName);
LAB_0016bafe:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&list);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveCreate(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,2,2))
		return nullptr;

	int64_t memoryAddress;
	StringLiteral inputName;

	if (!list[0].evaluateString(inputName,false))
		return nullptr;

	if (!list.back().evaluateInteger(memoryAddress))
		return nullptr;

	auto file = std::make_unique<CDirectiveFile>();
	file->initCreate(inputName.path(),memoryAddress);
	return file;
}